

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rep.c
# Opt level: O0

int rep0_pipe_start(void *arg)

{
  nni_mtx *mtx;
  uint16_t uVar1;
  uint32_t uVar2;
  int rv;
  rep0_sock *s;
  rep0_pipe *p;
  void *arg_local;
  
  mtx = *(nni_mtx **)((long)arg + 8);
  uVar1 = nni_pipe_peer(*arg);
  if (uVar1 == 0x30) {
    nni_mtx_lock(mtx);
    uVar2 = nni_pipe_id(*arg);
    arg_local._4_4_ = nni_id_set((nni_id_map *)((long)&mtx[1].mtx + 8),(ulong)uVar2,arg);
    nni_mtx_unlock(mtx);
    if (arg_local._4_4_ == 0) {
      nni_pipe_recv(*arg,(nni_aio *)((long)arg + 0x1e0));
      arg_local._4_4_ = 0;
    }
  }
  else {
    uVar1 = nni_pipe_peer(*arg);
    nng_log_warn("NNG-PEER-MISMATCH","Peer protocol mismatch: %d != %d, rejected.",(ulong)uVar1,0x30
                );
    arg_local._4_4_ = 0xd;
  }
  return arg_local._4_4_;
}

Assistant:

static int
rep0_pipe_start(void *arg)
{
	rep0_pipe *p = arg;
	rep0_sock *s = p->rep;
	int        rv;

	if (nni_pipe_peer(p->pipe) != REP0_PEER) {
		// Peer protocol mismatch.
		nng_log_warn("NNG-PEER-MISMATCH",
		    "Peer protocol mismatch: %d != %d, rejected.",
		    nni_pipe_peer(p->pipe), REP0_PEER);
		return (NNG_EPROTO);
	}

	nni_mtx_lock(&s->lk);
	rv = nni_id_set(&s->pipes, nni_pipe_id(p->pipe), p);
	nni_mtx_unlock(&s->lk);
	if (rv != 0) {
		return (rv);
	}
	// By definition, we have not received a request yet on this pipe,
	// so it cannot cause us to become writable.
	nni_pipe_recv(p->pipe, &p->aio_recv);
	return (0);
}